

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOSTypes.cpp
# Opt level: O2

void adios2::PrintMVI(ostream *os,MinVarInfo *mvi)

{
  uint uVar1;
  pointer pMVar2;
  ostream *poVar3;
  ulong uVar4;
  int i;
  long lVar5;
  ulong uVar6;
  MinBlockInfo *blk;
  pointer pMVar7;
  
  poVar3 = std::operator<<(os,"Step: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,"  Dims: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,mvi->Dims);
  std::operator<<(poVar3," Shape: {");
  uVar4 = (ulong)(uint)mvi->Dims;
  if ((mvi->Dims == 0) || (mvi->Shape == (size_t *)0x0)) {
    std::operator<<(os,"NULL");
  }
  else {
    for (lVar5 = 0; lVar5 < (int)uVar4; lVar5 = lVar5 + 1) {
      std::ostream::_M_insert<unsigned_long>((ulong)os);
      uVar4 = (ulong)mvi->Dims;
      if (lVar5 < (long)(uVar4 - 1)) {
        std::operator<<(os,", ");
        uVar4 = (ulong)(uint)mvi->Dims;
      }
    }
  }
  poVar3 = std::operator<<(os,"}, BlockCount: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3," ");
  pMVar2 = (mvi->BlocksInfo).
           super__Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pMVar7 = (mvi->BlocksInfo).
                super__Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>.
                _M_impl.super__Vector_impl_data._M_start; pMVar7 != pMVar2; pMVar7 = pMVar7 + 1) {
    uVar1 = mvi->Dims;
    lVar5 = (long)(int)uVar1;
    poVar3 = std::operator<<(os,"Writer: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pMVar7->WriterID);
    poVar3 = std::operator<<(poVar3,", Blk: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,", Start: {");
    if ((lVar5 == 0) || (pMVar7->Start == (size_t *)0x0)) {
      std::operator<<(os,"NULL");
    }
    else {
      uVar4 = 0;
      if (0 < (int)uVar1) {
        uVar4 = (ulong)uVar1;
      }
      for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
        std::ostream::_M_insert<unsigned_long>((ulong)os);
        if ((long)uVar6 < lVar5 + -1) {
          std::operator<<(os,", ");
        }
      }
    }
    std::operator<<(os,"}, Count: {");
    if ((uVar1 == 0) || (pMVar7->Count == (size_t *)0x0)) {
      std::operator<<(os,"NULL");
    }
    else {
      uVar4 = 0;
      if (0 < (int)uVar1) {
        uVar4 = (ulong)uVar1;
      }
      for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
        std::ostream::_M_insert<unsigned_long>((ulong)os);
        if ((long)uVar6 < lVar5 + -1) {
          std::operator<<(os,", ");
        }
      }
    }
    poVar3 = std::operator<<(os,"}, Data: ");
    poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::endl<char,std::char_traits<char>>(os);
  return;
}

Assistant:

void PrintMVI(std::ostream &os, const MinVarInfo &mvi)
{
    os << "Step: " << mvi.Step << "  Dims: " << mvi.Dims << " Shape: {";
    if ((mvi.Dims == 0) || (mvi.Shape == NULL))
        os << "NULL";
    else
    {
        for (int i = 0; i < mvi.Dims; i++)
        {
            os << mvi.Shape[i];
            if (i < mvi.Dims - 1)
                os << ", ";
        }
    }
    os << "}, BlockCount: " << mvi.BlocksInfo.size() << " ";
    for (const auto &blk : mvi.BlocksInfo)
        PrintMBI(os, blk, mvi.Dims);
    os << std::endl;
}